

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disabled_tests_decl.cpp
# Opt level: O2

void __thiscall
iu_DISABLED_FooP_x_iutest_x_Bar_Test::iu_DISABLED_FooP_x_iutest_x_Bar_Test
          (iu_DISABLED_FooP_x_iutest_x_Bar_Test *this)

{
  FooP::FooP(&this->super_type);
  (this->super_type).super_TestWithParam<int>.super_Test._vptr_Test =
       (_func_int **)&PTR__TestWithParam_0014a5d0;
  (this->super_type).super_TestWithParam<int>.super_WithParamInterface<int>._vptr_WithParamInterface
       = (_func_int **)&PTR__iu_DISABLED_FooP_x_iutest_x_Bar_Test_0014a610;
  return;
}

Assistant:

IUTEST_P(DISABLED_FooP, Bar)
{
    int v = GetParam();
    IUTEST_FAIL() << v;
}